

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O2

void operator_decay(op_type_conflict *op_pt)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  double dVar5;
  
  dVar5 = op_pt->amp;
  dVar1 = op_pt->sustain_level;
  if (dVar1 < dVar5) {
    dVar5 = dVar5 * op_pt->decaymul;
    op_pt->amp = dVar5;
  }
  uVar2 = op_pt->generator_pos >> 0x10;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    uVar3 = op_pt->cur_env_step + 1;
    op_pt->cur_env_step = uVar3;
    if ((op_pt->env_step_d & uVar3) == 0) {
      if (dVar5 <= dVar1) {
        if (op_pt->sus_keep == true) {
          op_pt->op_state = 3;
          op_pt->amp = dVar1;
          dVar5 = dVar1;
        }
        else {
          op_pt->op_state = 4;
        }
      }
      op_pt->step_amp = dVar5;
    }
  }
  op_pt->generator_pos = op_pt->generator_pos & 0xffff;
  return;
}

Assistant:

static void operator_decay(op_type* op_pt)
{
	Bit32u num_steps_add;
	Bit32u ct;
	
	if (op_pt->amp > op_pt->sustain_level)
	{
		// decay phase
		op_pt->amp *= op_pt->decaymul;
	}

	num_steps_add = op_pt->generator_pos/FIXEDPT;	// number of (standardized) samples
	for (ct=0; ct<num_steps_add; ct++)
	{
		op_pt->cur_env_step++;
		if ((op_pt->cur_env_step & op_pt->env_step_d)==0)
		{
			if (op_pt->amp <= op_pt->sustain_level)
			{
				// decay phase finished, sustain level reached
				if (op_pt->sus_keep)
				{
					// keep sustain level (until turned off)
					op_pt->op_state = OF_TYPE_SUS;
					op_pt->amp = op_pt->sustain_level;
				}
				else
				{
					// next: release phase
					op_pt->op_state = OF_TYPE_SUS_NOKEEP;
				}
			}
			op_pt->step_amp = op_pt->amp;
		}
	}
	op_pt->generator_pos -= num_steps_add*FIXEDPT;
}